

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::FeaturesTest_UninterpretedOptions_Test::TestBody
          (FeaturesTest_UninterpretedOptions_Test *this)

{
  bool bVar1;
  FileDescriptor *this_00;
  char *pcVar2;
  _Head_base<0UL,_const_char_*,_false> in_stack_fffffffffffffed0;
  AssertHelper local_e8;
  Message local_e0;
  FeatureSet local_d8;
  protobuf local_88 [8];
  char local_80 [8];
  undefined1 local_78 [8];
  AssertionResult gtest_ar_1;
  Message local_60 [3];
  protobuf local_48 [8];
  char local_40 [8];
  undefined1 local_38 [8];
  AssertionResult gtest_ar;
  FileDescriptor *file;
  FeaturesTest_UninterpretedOptions_Test *this_local;
  
  ValidationErrorTest::BuildDescriptorMessagesInTestPool((ValidationErrorTest *)this);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar.message_,
             "\n    name: \"foo.proto\"\n    syntax: \"editions\"\n    edition: EDITION_2023\n    options {\n      uninterpreted_option {\n        name { name_part: \"features\" is_extension: false }\n        name { name_part: \"field_presence\" is_extension: false }\n        identifier_value: \"IMPLICIT\"\n      }\n    }\n  "
            );
  this_00 = ValidationErrorTest::BuildFile((ValidationErrorTest *)this,stack0xffffffffffffffd8);
  EqualsProto<char_const*>(local_48,anon_var_dwarf_37cdd0 + 5);
  testing::internal::
  MakePredicateFormatterFromMatcher<google::protobuf::EqualsProtoMatcherP<char_const*>>
            ((EqualsProtoMatcherP<const_char_*>)in_stack_fffffffffffffed0._M_head_impl);
  FileDescriptor::options(this_00);
  testing::internal::
  PredicateFormatterFromMatcher<google::protobuf::EqualsProtoMatcherP<char_const*>>::operator()
            ((AssertionResult *)local_38,local_40,(FileOptions *)0x1d0efe5);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    testing::Message::Message(local_60);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_38);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x2d5d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  EqualsProto<char_const*>
            (local_88,
             "\n                field_presence: IMPLICIT\n                enum_type: OPEN\n                repeated_field_encoding: PACKED\n                utf8_validation: VERIFY\n                message_encoding: LENGTH_PREFIXED\n                json_format: ALLOW\n                enforce_naming_style: STYLE_LEGACY\n                default_symbol_visibility: EXPORT_ALL\n                [pb.cpp] {\n                  legacy_closed_enum: false\n                  string_type: STRING\n                  enum_name_uses_string_view: false\n                }"
            );
  testing::internal::
  MakePredicateFormatterFromMatcher<google::protobuf::EqualsProtoMatcherP<char_const*>>
            ((EqualsProtoMatcherP<const_char_*>)in_stack_fffffffffffffed0._M_head_impl);
  GetCoreFeatures<google::protobuf::FileDescriptor>(&local_d8,this_00);
  testing::internal::
  PredicateFormatterFromMatcher<google::protobuf::EqualsProtoMatcherP<char_const*>>::operator()
            (local_78,local_80,(FeatureSet *)"GetCoreFeatures(file)");
  FeatureSet::~FeatureSet(&local_d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar1) {
    testing::Message::Message(&local_e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_78);
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x2d6b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_e8,&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    testing::Message::~Message(&local_e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  return;
}

Assistant:

TEST_F(FeaturesTest, UninterpretedOptions) {
  BuildDescriptorMessagesInTestPool();
  const FileDescriptor* file = BuildFile(R"pb(
    name: "foo.proto"
    syntax: "editions"
    edition: EDITION_2023
    options {
      uninterpreted_option {
        name { name_part: "features" is_extension: false }
        name { name_part: "field_presence" is_extension: false }
        identifier_value: "IMPLICIT"
      }
    }
  )pb");
  EXPECT_THAT(file->options(), EqualsProto(""));
  EXPECT_THAT(GetCoreFeatures(file), EqualsProto(R"pb(
                field_presence: IMPLICIT
                enum_type: OPEN
                repeated_field_encoding: PACKED
                utf8_validation: VERIFY
                message_encoding: LENGTH_PREFIXED
                json_format: ALLOW
                enforce_naming_style: STYLE_LEGACY
                default_symbol_visibility: EXPORT_ALL
                [pb.cpp] {
                  legacy_closed_enum: false
                  string_type: STRING
                  enum_name_uses_string_view: false
                })pb"));
}